

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_sinh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  int8_t roundingPrecision;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  uint uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint64_t uVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 fVar12;
  floatx80 fVar13;
  floatx80 fVar14;
  floatx80 fVar15;
  
  fVar12.low = a.low;
  uVar9 = a._8_4_;
  uVar6 = (ulong)uVar9;
  if ((~uVar9 & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      auVar2 = a._0_12_;
      a_00._12_4_ = 0;
      a_00.low = auVar2._0_8_;
      a_00.high = auVar2._8_2_;
      a_00._10_2_ = auVar2._10_2_;
      fVar12 = propagateFloatx80NaNOneArg(a_00,status);
      return fVar12;
    }
    uVar6 = (ulong)(ushort)((a.high & 0x8000) + 0x7fff);
  }
  else {
    uVar10 = uVar9 & 0x7fff;
    if (fVar12.low != 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0
       ) {
      uVar11 = (uVar9 & 0xffff) >> 0xf;
      cVar1 = status->float_rounding_mode;
      roundingPrecision = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      uVar4 = (uint)a.low._6_2_ | uVar10 << 0x10;
      if (uVar4 < 0x400cb168) {
        fVar12._8_4_ = uVar10;
        fVar12._12_4_ = 0;
        fVar12 = floatx80_etoxm1_m68k(fVar12,status);
        fVar13 = float32_to_floatx80_m68k(0x3f800000,status);
        b._8_8_ = fVar13._8_8_ & 0xffffffff;
        auVar2 = fVar12._0_12_;
        fVar14._12_4_ = 0;
        fVar14.low = auVar2._0_8_;
        fVar14.high = auVar2._8_2_;
        fVar14._10_2_ = auVar2._10_2_;
        b.low = fVar13.low;
        fVar12 = floatx80_add_m68k(fVar14,b,status);
        b_00._8_8_ = fVar12._8_8_ & 0xffffffff;
        fVar13._12_4_ = 0;
        fVar13.low = auVar2._0_8_;
        fVar13.high = auVar2._8_2_;
        fVar13._10_2_ = auVar2._10_2_;
        b_00.low = fVar12.low;
        fVar12 = floatx80_div_m68k(fVar13,b_00,status);
        auVar3 = fVar12._0_12_;
        a_01._12_4_ = 0;
        a_01.low = auVar3._0_8_;
        a_01.high = auVar3._8_2_;
        a_01._10_2_ = auVar3._10_2_;
        b_01._12_4_ = 0;
        b_01.low = auVar2._0_8_;
        b_01.high = auVar2._8_2_;
        b_01._10_2_ = auVar2._10_2_;
        fVar12 = floatx80_add_m68k(a_01,b_01,status);
        uVar5 = fVar12.low;
        uVar8 = fVar12._8_4_;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = roundingPrecision;
        fVar12 = float32_to_floatx80_m68k(uVar11 << 0x1f | 0x3f000000,status);
        uVar7 = fVar12.low;
        uVar6 = fVar12._8_8_ & 0xffffffff;
      }
      else {
        if (0x400cb2b3 < uVar4) {
          status->float_rounding_mode = cVar1;
          status->floatx80_rounding_precision = roundingPrecision;
          fVar12 = roundAndPackFloatx80_m68k
                             (roundingPrecision,(flag)uVar11,0x8000,fVar12.low,0,status);
          return fVar12;
        }
        fVar14 = float64_to_floatx80_m68k(0x40c62d38d3d64634,status);
        b_02._8_8_ = fVar14._8_8_ & 0xffffffff;
        a_02._8_4_ = uVar10;
        a_02.low = fVar12.low;
        a_02._12_4_ = 0;
        b_02.low = fVar14.low;
        fVar12 = floatx80_sub_m68k(a_02,b_02,status);
        fVar14 = float64_to_floatx80_m68k(0x3d6f90aeb1e75cc7,status);
        b_03._8_8_ = fVar14._8_8_ & 0xffffffff;
        auVar2 = fVar12._0_12_;
        a_03._12_4_ = 0;
        a_03.low = auVar2._0_8_;
        a_03.high = auVar2._8_2_;
        a_03._10_2_ = auVar2._10_2_;
        b_03.low = fVar14.low;
        fVar12 = floatx80_sub_m68k(a_03,b_03,status);
        auVar2 = fVar12._0_12_;
        a_04._12_4_ = 0;
        a_04.low = auVar2._0_8_;
        a_04.high = auVar2._8_2_;
        a_04._10_2_ = auVar2._10_2_;
        fVar12 = floatx80_etox_m68k(a_04,status);
        uVar5 = fVar12.low;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = roundingPrecision;
        uVar7 = 0x8000000000000000;
        uVar8 = fVar12._8_4_;
        uVar6 = (ulong)(uVar9 & 0xffff8000 | 0x7ffb);
      }
      a_05._8_4_ = uVar8;
      a_05.low = uVar5;
      a_05._12_4_ = 0;
      b_04._8_8_ = uVar6;
      b_04.low = uVar7;
      fVar12 = floatx80_mul_m68k(a_05,b_04,status);
      uVar7 = fVar12.low;
      float_raise_m68k(' ',status);
      uVar6 = (ulong)fVar12._8_4_;
      goto LAB_00673a21;
    }
  }
  uVar7 = 0;
LAB_00673a21:
  fVar15._8_8_ = uVar6;
  fVar15.low = uVar7;
  return fVar15;
}

Assistant:

floatx80 floatx80_sinh(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1, fp2;
    float32 fact;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        return packFloatx80(aSign, floatx80_infinity.high,
                            floatx80_infinity.low);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact > 0x400CB167) {
        /* SINHBIG */
        if (compact > 0x400CB2B3) {
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                        aSign, 0x8000, aSig, 0, status);
        } else {
            fp0 = floatx80_abs(a); /* Y = |X| */
            fp0 = floatx80_sub(fp0, float64_to_floatx80(
                               make_float64(0x40C62D38D3D64634), status),
                               status); /* (|X|-16381LOG2_LEAD) */
            fp0 = floatx80_sub(fp0, float64_to_floatx80(
                               make_float64(0x3D6F90AEB1E75CC7), status),
                               status); /* |X| - 16381 LOG2, ACCURATE */
            fp0 = floatx80_etox(fp0, status);
            fp2 = packFloatx80(aSign, 0x7FFB, one_sig);

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_mul(fp0, fp2, status);

            float_raise(float_flag_inexact, status);

            return a;
        }
    } else { /* |X| < 16380 LOG2 */
        fp0 = floatx80_abs(a); /* Y = |X| */
        fp0 = floatx80_etoxm1(fp0, status); /* FP0 IS Z = EXPM1(Y) */
        fp1 = floatx80_add(fp0, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* 1+Z */
        fp2 = fp0;
        fp0 = floatx80_div(fp0, fp1, status); /* Z/(1+Z) */
        fp0 = floatx80_add(fp0, fp2, status);

        fact = packFloat32(aSign, 0x7E, 0);

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_mul(fp0, float32_to_floatx80(fact, status), status);

        float_raise(float_flag_inexact, status);

        return a;
    }
}